

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

void ffcmrk(void)

{
  char cVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = (long)ffxmsg::nummsg;
  if (0 < lVar2) {
    do {
      lVar3 = lVar2 + -1;
      cVar1 = **(char **)(&DAT_003623d8 + lVar2 * 8);
      **(char **)(&DAT_003623d8 + lVar2 * 8) = '\0';
      if (lVar2 < 2) break;
      lVar2 = lVar3;
    } while (cVar1 != '\x1b');
    ffxmsg::nummsg = (int)lVar3;
  }
  return;
}

Assistant:

void ffxmsg( int action,
            char *errmsg)
/*
  general routine to get, put, or clear the error message stack.
  Use a static array rather than allocating memory as needed for
  the error messages because it is likely to be more efficient
  and simpler to implement.

  Action Code:
DelAll     1  delete all messages on the error stack 
DelMark    2  delete messages back to and including the 1st marker 
DelNewest  3  delete the newest message from the stack 
GetMesg    4  pop and return oldest message, ignoring marks 
PutMesg    5  add a new message to the stack 
PutMark    6  add a marker to the stack 

*/
{
    int ii;
    char markflag;
    static char *txtbuff[errmsgsiz], *tmpbuff, *msgptr;
    static char errbuff[errmsgsiz][81];  /* initialize all = \0 */
    static int nummsg = 0;

    FFLOCK;
    
    if (action == DelAll)  /* clear the whole message stack */
    {
      for (ii = 0; ii < nummsg; ii ++)
        *txtbuff[ii] = '\0';

      nummsg = 0;
    }
    else if (action == DelMark)  /* clear up to and including first marker */
    {
      while (nummsg > 0) {
        nummsg--;  
        markflag = *txtbuff[nummsg]; /* store possible marker character */
        *txtbuff[nummsg] = '\0';  /* clear the buffer for this msg */

        if (markflag == ESMARKER)
           break;   /* found a marker, so quit */
      }
    }
    else if (action == DelNewest)  /* remove newest message from stack */ 
    {
      if (nummsg > 0)
      {
        nummsg--;  
        *txtbuff[nummsg] = '\0';  /* clear the buffer for this msg */
      }
    }
    else if (action == GetMesg)  /* pop and return oldest message from stack */ 
    {                            /* ignoring markers */
      while (nummsg > 0)
      {
         strcpy(errmsg, txtbuff[0]);   /* copy oldest message to output */

         *txtbuff[0] = '\0';  /* clear the buffer for this msg */
           
         nummsg--;  
         for (ii = 0; ii < nummsg; ii++)
             txtbuff[ii] = txtbuff[ii + 1]; /* shift remaining pointers */

         if (errmsg[0] != ESMARKER) {   /* quit if this is not a marker */
            FFUNLOCK;
            return;
         }
       }
       errmsg[0] = '\0';  /*  no messages in the stack */
    }
    else if (action == PutMesg)  /* add new message to stack */
    {
     msgptr = errmsg;
     while (strlen(msgptr))
     {
      if (nummsg == errmsgsiz)
      {
        tmpbuff = txtbuff[0];  /* buffers full; reuse oldest buffer */
        *txtbuff[0] = '\0';  /* clear the buffer for this msg */

        nummsg--;
        for (ii = 0; ii < nummsg; ii++)
             txtbuff[ii] = txtbuff[ii + 1];   /* shift remaining pointers */

        txtbuff[nummsg] = tmpbuff;  /* set pointer for the new message */
      }
      else
      {
        for (ii = 0; ii < errmsgsiz; ii++)
        {
          if (*errbuff[ii] == '\0') /* find first empty buffer */
          {
            txtbuff[nummsg] = errbuff[ii];
            break;
          }
        }
      }

      strncat(txtbuff[nummsg], msgptr, 80);
      nummsg++;

      msgptr += minvalue(80, strlen(msgptr));
     }
    }
    else if (action == PutMark)  /* put a marker on the stack */
    {
      if (nummsg == errmsgsiz)
      {
        tmpbuff = txtbuff[0];  /* buffers full; reuse oldest buffer */
        *txtbuff[0] = '\0';  /* clear the buffer for this msg */

        nummsg--;
        for (ii = 0; ii < nummsg; ii++)
             txtbuff[ii] = txtbuff[ii + 1];   /* shift remaining pointers */

        txtbuff[nummsg] = tmpbuff;  /* set pointer for the new message */
      }
      else
      {
        for (ii = 0; ii < errmsgsiz; ii++)
        {
          if (*errbuff[ii] == '\0') /* find first empty buffer */
          {
            txtbuff[nummsg] = errbuff[ii];
            break;
          }
        }
      }

      *txtbuff[nummsg] = ESMARKER;      /* write the marker */
      *(txtbuff[nummsg] + 1) = '\0';
      nummsg++;

    }

    FFUNLOCK;
    return;
}